

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O2

iterator * __thiscall csv::CSVReader::begin(iterator *__return_storage_ptr__,CSVReader *this)

{
  ThreadSafeDeque<csv::CSVRow> *this_00;
  CSVReader *local_58;
  thread local_50;
  CSVRow local_48;
  
  this_00 = (this->records)._M_t.
            super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
            .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
            _M_head_impl;
  if (((iterator *)
      ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x30))
      ->_M_cur ==
      ((iterator *)
      ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x10))
      ->_M_cur) {
    local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)read_csv;
    local_48.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = this;
    std::thread::
    thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
              (&local_50,(type *)&local_48,&local_58,&internals::ITERATION_CHUNK_SIZE);
    std::thread::operator=(&this->read_csv_worker,&local_50);
    std::thread::~thread(&local_50);
    std::thread::join();
    this_00 = (this->records)._M_t.
              super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
              .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
              _M_head_impl;
    if (((iterator *)
        ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x30)
        )->_M_cur ==
        ((iterator *)
        ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> + 0x10)
        )->_M_cur) {
      (__return_storage_ptr__->row).fields_start = 0;
      (__return_storage_ptr__->row).row_length = 0;
      (__return_storage_ptr__->row).data.
      super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->row).data_start = 0;
      __return_storage_ptr__->daddy = (CSVReader *)0x0;
      (__return_storage_ptr__->row).data.
      super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __return_storage_ptr__->i = 0;
      return __return_storage_ptr__;
    }
  }
  this->_n_rows = this->_n_rows + 1;
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_48,this_00);
  iterator::iterator(__return_storage_ptr__,this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader::iterator CSVReader::begin() {
        if (this->records->empty()) {
            this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
            this->read_csv_worker.join();

            // Still empty => return end iterator
            if (this->records->empty()) return this->end();
        }

        this->_n_rows++;
        CSVReader::iterator ret(this, this->records->pop_front());
        return ret;
    }